

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::connectInterfaces
          (CoreBroker *this,BasicHandleInfo *origin,uint32_t originFlags,BasicHandleInfo *target,
          uint32_t targetFlags,
          pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> actions)

{
  string_view name;
  string_view name_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  bool bVar1;
  route_id rVar2;
  route_id rVar3;
  GlobalHandle *in_RCX;
  uint16_t in_DX;
  GlobalHandle *in_RSI;
  long *in_RDI;
  uint16_t in_R8W;
  undefined8 in_R9;
  __sv_type _Var4;
  ActionMessage connect;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe88;
  action_t in_stack_fffffffffffffe8c;
  GlobalFederateId in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  size_t in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  ActionMessage local_e8;
  uint16_t local_2c;
  GlobalHandle *local_28;
  uint16_t local_1c;
  GlobalHandle *local_18;
  action_t aStack_4;
  
  aStack_4 = (action_t)((ulong)in_R9 >> 0x20);
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_1c = in_DX;
  local_2c = in_R8W;
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90.gid),
             in_stack_fffffffffffffe8c);
  ActionMessage::setSource(&local_e8,*local_18);
  ActionMessage::setDestination(&local_e8,*local_28);
  local_e8.flags = local_1c;
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  name._M_str._0_4_ = in_stack_fffffffffffffe70;
  name._M_len = in_stack_fffffffffffffe68;
  name._M_str._4_4_ = in_stack_fffffffffffffe74;
  ActionMessage::name((ActionMessage *)0x5efcab,name);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5efcbe);
  if (!bVar1) {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    str._M_str = in_stack_fffffffffffffea0;
    str._M_len = in_stack_fffffffffffffe98;
    ActionMessage::setString
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90.gid),
               in_stack_fffffffffffffe8c,str);
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5efd31);
  if (!bVar1) {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    str_00._M_str = in_stack_fffffffffffffea0;
    str_00._M_len = in_stack_fffffffffffffe98;
    ActionMessage::setString
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90.gid),
               in_stack_fffffffffffffe8c,str_00);
  }
  rVar2 = getRoute((CoreBroker *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   in_stack_fffffffffffffe90);
  (**(code **)(*in_RDI + 0x110))(in_RDI,rVar2.rid,&local_e8);
  ActionMessage::setAction(&local_e8,aStack_4);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(rVar2.rid,in_stack_fffffffffffffe70));
  name_00._M_str._0_4_ = in_stack_fffffffffffffe70;
  name_00._M_len = in_stack_fffffffffffffe68;
  name_00._M_str._4_4_ = rVar2.rid;
  ActionMessage::name((ActionMessage *)0x5efdfe,name_00);
  ActionMessage::clearStringData((ActionMessage *)0x5efe0d);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5efe20);
  if (!bVar1) {
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(rVar2.rid,in_stack_fffffffffffffe70));
    in_stack_fffffffffffffea0 = (char *)_Var4._M_len;
    str_01._M_str = in_stack_fffffffffffffea0;
    str_01._M_len = in_stack_fffffffffffffe98;
    ActionMessage::setString
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90.gid),
               in_stack_fffffffffffffe8c,str_01);
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5efe6d);
  if (!bVar1) {
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(rVar2.rid,in_stack_fffffffffffffe70));
    in_stack_fffffffffffffe90.gid = _Var4._M_len._0_4_;
    str_02._M_str = in_stack_fffffffffffffea0;
    str_02._M_len = (size_t)_Var4._M_str;
    ActionMessage::setString((ActionMessage *)_Var4._M_len,in_stack_fffffffffffffe8c,str_02);
  }
  local_e8.flags = local_2c;
  ActionMessage::swapSourceDest((ActionMessage *)CONCAT44(rVar2.rid,in_stack_fffffffffffffe70));
  rVar3 = getRoute((CoreBroker *)CONCAT44(in_stack_fffffffffffffe8c,local_e8.dest_id.gid),
                   in_stack_fffffffffffffe90);
  (**(code **)(*in_RDI + 0x110))(in_RDI,rVar3.rid,&local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(rVar2.rid,rVar3.rid));
  return;
}

Assistant:

void CoreBroker::connectInterfaces(
    const BasicHandleInfo& origin,
    uint32_t originFlags,
    const BasicHandleInfo& target,
    uint32_t targetFlags,
    std::pair<action_message_def::action_t, action_message_def::action_t> actions)
{
    // notify the target about an origin
    ActionMessage connect(actions.first);
    connect.setSource(origin.handle);
    connect.setDestination(target.handle);
    connect.flags = originFlags;
    connect.name(origin.key);
    if (!origin.type.empty()) {
        connect.setString(typeStringLoc, origin.type);
    }
    if (!origin.units.empty()) {
        connect.setString(unitStringLoc, origin.units);
    }
    transmit(getRoute(connect.dest_id), connect);

    connect.setAction(actions.second);
    connect.name(target.key);
    connect.clearStringData();
    if (!target.type.empty()) {
        connect.setString(typeStringLoc, target.type);
    }
    if (!target.units.empty()) {
        connect.setString(unitStringLoc, target.units);
    }

    connect.flags = targetFlags;

    connect.swapSourceDest();
    transmit(getRoute(connect.dest_id), connect);
}